

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNodeListImpl.cpp
# Opt level: O0

XMLSize_t __thiscall xercesc_4_0::DOMNodeListImpl::getLength(DOMNodeListImpl *this)

{
  DOMChildNode *pDVar1;
  DOMNode *local_20;
  DOMNode *node;
  XMLSize_t count;
  DOMNodeListImpl *this_local;
  
  node = (DOMNode *)0x0;
  if (this->fNode != (DOMParentNode *)0x0) {
    local_20 = this->fNode->fFirstChild;
    while (local_20 != (DOMNode *)0x0) {
      node = (DOMNode *)((long)&node->_vptr_DOMNode + 1);
      pDVar1 = castToChildImpl(local_20);
      local_20 = pDVar1->nextSibling;
    }
  }
  return (XMLSize_t)node;
}

Assistant:

XMLSize_t DOMNodeListImpl::getLength() const{
    XMLSize_t count = 0;
    if (fNode) {
        DOMNode *node = fNode->fFirstChild;
        while(node != 0){
            ++count;
            node = castToChildImpl(node)->nextSibling;
        }
    }

    return count;
}